

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcalendarwidget.cpp
# Opt level: O1

int __thiscall QCalendarWidget::qt_metacall(QCalendarWidget *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined8 *puVar1;
  QCalendarWidget *_t;
  
  _id_00 = QWidget::qt_metacall(&this->super_QWidget,_c,_id,_a);
  if (_id_00 < 0) {
    return _id_00;
  }
  if (_c == InvokeMetaMethod) {
    if (_id_00 < 0x18) {
      qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
    }
    _id_00 = _id_00 + -0x18;
  }
  if (_c != RegisterMethodArgumentMetaType) goto LAB_003d4f6c;
  if (_id_00 < 0x18) {
    if (_id_00 == 0x17) {
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
        goto LAB_003d4f69;
      }
    }
    else {
      puVar1 = (undefined8 *)*_a;
    }
    *puVar1 = 0;
  }
LAB_003d4f69:
  _id_00 = _id_00 + -0x18;
LAB_003d4f6c:
  if ((_c < CustomCall) && ((0x14eU >> (_c & 0x1f) & 1) != 0)) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    _id_00 = _id_00 + -0xb;
  }
  return _id_00;
}

Assistant:

int QCalendarWidget::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 24)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 24;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 24)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 24;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 11;
    }
    return _id;
}